

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::TemplatedFetchCommittedRange<float>
               (UpdateInfo *info,idx_t start,idx_t end,idx_t result_offset,Vector *result)

{
  uint uVar1;
  uint uVar2;
  data_ptr_t pdVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = info->N;
  if ((ulong)uVar1 != 0) {
    uVar2 = info->max;
    pdVar3 = result->data;
    uVar5 = 0;
    do {
      uVar6 = (ulong)*(uint *)((long)&info[1].segment + uVar5 * 4);
      bVar4 = false;
      if ((start <= uVar6) && (bVar4 = true, uVar6 < end)) {
        *(undefined4 *)(pdVar3 + uVar6 * 4 + (result_offset - start) * 4) =
             *(undefined4 *)((long)&info[1].segment + uVar5 * 4 + (ulong)uVar2 * 4);
        bVar4 = false;
      }
    } while ((!bVar4) && (uVar5 = uVar5 + 1, uVar1 != uVar5));
  }
  return;
}

Assistant:

static void TemplatedFetchCommittedRange(UpdateInfo &info, idx_t start, idx_t end, idx_t result_offset,
                                         Vector &result) {
	auto result_data = FlatVector::GetData<T>(result);
	MergeUpdateInfoRange<T>(info, start, end, result_offset, result_data);
}